

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O1

void __thiscall helics::HandleManager::removeHandle(HandleManager *this,GlobalHandle handle)

{
  iterator *this_00;
  InterfaceType IVar1;
  int iVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  size_type sVar5;
  reference pBVar6;
  ulong uVar7;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var8;
  _Hash_node_base *p_Var9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  _Node_iterator_base<std::pair<const_unsigned_long,_int>,_false> __it;
  size_type local_40;
  pointer local_38;
  
  p_Var9 = (_Hash_node_base *)((long)handle << 0x20 | (ulong)handle >> 0x20);
  uVar3 = (this->unique_ids)._M_h._M_bucket_count;
  uVar7 = (ulong)p_Var9 % uVar3;
  p_Var10 = (this->unique_ids)._M_h._M_buckets[uVar7];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var10->_M_nxt, p_Var11 = p_Var10, p_Var9 != p_Var10->_M_nxt[1]._M_nxt)) {
    while (p_Var10 = p_Var4, p_Var4 = p_Var10->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % uVar3 != uVar7) ||
         (p_Var11 = p_Var10, p_Var9 == p_Var4[1]._M_nxt)) goto LAB_00361453;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_00361453:
  if (p_Var11 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var11->_M_nxt;
  }
  if (__it._M_cur == (__node_type *)0x0) {
    return;
  }
  iVar2 = *(int *)((long)__it._M_cur + 0x10);
  this_00 = &(this->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_start;
  pBVar6 = std::
           _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
           ::operator[](this_00,(long)iVar2);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(this->unique_ids)._M_h,(const_iterator)__it._M_cur);
  sVar5 = (pBVar6->key)._M_string_length;
  if (sVar5 == 0) goto LAB_0036159a;
  IVar1 = pBVar6->handleType;
  if (IVar1 < PUBLICATION) {
    if (IVar1 == ENDPOINT) {
      p_Var8 = &(this->endpoints)._M_h;
    }
    else if (IVar1 == FILTER) {
      p_Var8 = &(this->filters)._M_h;
    }
    else {
      if (IVar1 != INPUT) goto LAB_0036159a;
      p_Var8 = &(this->inputs)._M_h;
    }
LAB_00361540:
    local_38 = (pBVar6->key)._M_dataplus._M_p;
    local_40 = sVar5;
  }
  else {
    if (IVar1 == PUBLICATION) {
      p_Var8 = &(this->publications)._M_h;
      goto LAB_00361540;
    }
    if (IVar1 == SINK) {
      local_38 = (pBVar6->key)._M_dataplus._M_p;
      local_40 = sVar5;
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&(this->inputs)._M_h,&local_40);
      p_Var8 = &(this->endpoints)._M_h;
    }
    else {
      if (IVar1 != TRANSLATOR) goto LAB_0036159a;
      local_38 = (pBVar6->key)._M_dataplus._M_p;
      local_40 = sVar5;
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&(this->inputs)._M_h,&local_40);
      local_38 = (pBVar6->key)._M_dataplus._M_p;
      local_40 = (pBVar6->key)._M_string_length;
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&(this->endpoints)._M_h,&local_40);
      p_Var8 = &(this->publications)._M_h;
    }
    local_38 = (pBVar6->key)._M_dataplus._M_p;
    local_40 = (pBVar6->key)._M_string_length;
  }
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase(p_Var8,&local_40);
LAB_0036159a:
  pBVar6 = std::
           _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
           ::operator[](this_00,(long)iVar2);
  (pBVar6->handle).fed_id = -2010000000;
  (pBVar6->handle).handle = -1700000000;
  pBVar6->local_fed_id = -2000000000;
  pBVar6->handleType = UNKNOWN;
  pBVar6->used = false;
  pBVar6->flags = 0;
  (pBVar6->key)._M_dataplus._M_p = (pointer)&(pBVar6->key).field_2;
  (pBVar6->key)._M_string_length = 0;
  (pBVar6->key).field_2._M_local_buf[0] = '\0';
  (pBVar6->type)._M_dataplus._M_p = (pointer)&(pBVar6->type).field_2;
  (pBVar6->type)._M_string_length = 0;
  (pBVar6->type).field_2._M_local_buf[0] = '\0';
  (pBVar6->units)._M_dataplus._M_p = (pointer)&(pBVar6->units).field_2;
  (pBVar6->units)._M_string_length = 0;
  (pBVar6->units).field_2._M_local_buf[0] = '\0';
  pBVar6->type_in = &pBVar6->type;
  pBVar6->type_out = &pBVar6->units;
  (pBVar6->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar6->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar6->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

void HandleManager::removeHandle(GlobalHandle handle)
{
    auto key = static_cast<uint64_t>(handle);
    auto fnd = unique_ids.find(key);
    if (fnd == unique_ids.end()) {
        return;
    }
    auto index = fnd->second;
    auto& info = handles[index];
    unique_ids.erase(fnd);
    if (!info.key.empty()) {
        switch (info.handleType) {
            case InterfaceType::ENDPOINT:
                endpoints.erase(info.key);
                break;
            case InterfaceType::PUBLICATION:
                publications.erase(info.key);
                break;
            case InterfaceType::FILTER:
                filters.erase(info.key);
                break;
            case InterfaceType::INPUT:
                inputs.erase(info.key);
                break;
            case InterfaceType::TRANSLATOR:
                inputs.erase(info.key);
                endpoints.erase(info.key);
                publications.erase(info.key);
                break;
            case InterfaceType::SINK:
                inputs.erase(info.key);
                endpoints.erase(info.key);
                break;
            default:
                break;
        }
    }
    // construct a blank at the previous index
    new (&(handles[index])) BasicHandleInfo;
}